

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

macro_call_t try_param_macro_call(c2m_ctx_t c2m_ctx,macro_t m,token_t macro_id)

{
  char cVar1;
  ushort uVar2;
  short sVar3;
  pre_ctx *ppVar4;
  macro_t pmVar5;
  VARR_macro_call_t *pVVar6;
  long lVar7;
  VARR_token_t *pVVar8;
  undefined8 *puVar9;
  VARR_char *pVVar10;
  VARR_char *pVVar11;
  pos_t p;
  int iVar12;
  int iVar13;
  token_t ptVar14;
  token_t t;
  macro_call_t pmVar15;
  VARR_token_arr_t *pVVar16;
  ulong *puVar17;
  void *pvVar18;
  c2m_ctx_t pcVar19;
  token_arr_t pVVar20;
  token_arr_t *ppVVar21;
  macro_call_t *__ptr;
  c2m_ctx_t pcVar22;
  node_t_conflict n;
  undefined4 *puVar23;
  VARR_token_t *pVVar24;
  token_t *pptVar25;
  uint uVar26;
  MIR_context_t pMVar27;
  undefined1 *puVar28;
  uint uVar29;
  ulong uVar30;
  MIR_context_t pMVar31;
  char *format;
  undefined8 extraout_RDX;
  c2m_ctx_t pcVar32;
  c2m_ctx_t pcVar33;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t pcVar34;
  char *pcVar35;
  char **in_R8;
  token_t t_00;
  MIR_context_t pMVar36;
  c2m_ctx_t pcVar37;
  ulong uVar38;
  MIR_context_t pMVar39;
  MIR_context_t pMVar40;
  size_t sVar41;
  c2m_ctx_t pcVar42;
  c2m_ctx_t pcVar43;
  size_t __size;
  c2mir_options *pcVar44;
  bool bVar45;
  bool bVar46;
  str_t sVar47;
  MIR_context_t local_80;
  MIR_context_t local_68;
  MIR_context_t local_60;
  c2m_ctx_t local_48;
  
  ppVar4 = c2m_ctx->pre_ctx;
  while( true ) {
    ptVar14 = get_next_pptoken_1(c2m_ctx,0);
    if ((short)*(uint *)ptVar14 != 0x145) break;
    pop_macro_call((c2m_ctx_t)c2m_ctx->pre_ctx->macro_call_stack);
  }
  uVar26 = *(uint *)ptVar14 & 0xffff;
  pMVar27 = (MIR_context_t)(ulong)uVar26;
  if ((uVar26 == 10) || (uVar26 == 0x20)) {
    t = get_next_pptoken_1(c2m_ctx,0);
    pMVar27 = (MIR_context_t)(ulong)*(ushort *)t;
    t_00 = ptVar14;
  }
  else {
    t_00 = (token_t)0x0;
    t = ptVar14;
  }
  if ((int)pMVar27 != 0x28) {
    unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,t);
    if (t_00 != (token_t)0x0) {
      unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,t_00);
    }
    out_token(c2m_ctx,macro_id);
    return (macro_call_t)0x0;
  }
  pcVar33 = (c2m_ctx_t)(macro_id->pos).fname;
  pmVar15 = new_macro_call(m,macro_id->pos);
  pmVar5 = pmVar15->macro;
  c2m_ctx_00 = (c2m_ctx_t)&DAT_00000018;
  pVVar16 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar16 == (VARR_token_arr_t *)0x0) {
LAB_00191caf:
    mir_varr_error((char *)c2m_ctx_00);
  }
  pVVar16->els_num = 0;
  pVVar16->size = 0x10;
  local_48 = (c2m_ctx_t)malloc(0x80);
  c2m_ctx_00 = (c2m_ctx_t)&DAT_00000018;
  pVVar16->varr = (token_arr_t *)local_48;
  puVar17 = (ulong *)malloc(0x18);
  if (puVar17 == (ulong *)0x0) goto LAB_00191caf;
  c2m_ctx_00 = (c2m_ctx_t)0x80;
  *puVar17 = 0;
  puVar17[1] = 0x10;
  pvVar18 = malloc(0x80);
  puVar17[2] = (ulong)pvVar18;
  pVVar24 = pmVar5->params;
  if (pVVar24 == (VARR_token_t *)0x0) {
LAB_00191cc3:
    try_param_macro_call_cold_16();
LAB_00191cc8:
    try_param_macro_call_cold_14();
    goto LAB_00191ccd;
  }
  pMVar31 = (MIR_context_t)pVVar24->els_num;
  iVar12 = 0;
  bVar45 = false;
  if (pMVar31 != (MIR_context_t)0x1) {
LAB_00191751:
    pMVar36 = (MIR_context_t)0x10;
    bVar46 = false;
    local_68 = (MIR_context_t)0x0;
    local_60 = (MIR_context_t)0x0;
    pMVar39 = (MIR_context_t)((long)&pMVar31[-1].wrapper_end_addr + 7);
    do {
      pcVar33 = (c2m_ctx_t)0x0;
      c2m_ctx_00 = c2m_ctx;
      pcVar19 = (c2m_ctx_t)get_next_pptoken_1(c2m_ctx,0);
      uVar2 = *(ushort *)&pcVar19->ctx;
      if (uVar2 == 0x145) {
        pcVar33 = (c2m_ctx_t)0x0;
        pcVar19 = (c2m_ctx_t)get_next_pptoken_1(c2m_ctx,0);
        c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->pre_ctx->macro_call_stack;
        pop_macro_call(c2m_ctx_00);
        uVar2 = *(ushort *)&pcVar19->ctx;
      }
      uVar26 = (uint)uVar2;
      uVar29 = uVar26 * 0x10000 + 0xfec30000 >> 0x10;
      if (((uVar29 < 0xb) && (pcVar33 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar29 & 0x1f) & 1) != 0)) ||
         (pMVar27 = (MIR_context_t)(ulong)CONCAT31((int3)(uVar26 * 0x10000 >> 8),uVar26 == 0x23),
         (bool)(bVar46 & uVar26 == 0x23))) {
LAB_001919f1:
        if (uVar26 != 0x29) {
          in_R8 = (char **)pmVar5->id->repr;
          error(c2m_ctx,0x1c19de,(char *)pcVar19->options,pcVar19->env[0].__jmpbuf[0]);
          c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->buffered_tokens;
          pcVar33 = pcVar19;
          unget_next_pptoken(c2m_ctx_00,(token_t)pcVar19);
        }
        pMVar27 = local_68;
        if (local_48 == (c2m_ctx_t)0x0) goto LAB_00191cc8;
        pMVar39 = (MIR_context_t)((long)&local_68->gen_ctx + 1);
        if (pMVar36 < pMVar39) {
          pMVar36 = (MIR_context_t)((long)&pMVar39->gen_ctx + ((ulong)pMVar39 >> 1));
          pcVar33 = (c2m_ctx_t)((long)pMVar36 * 8);
          c2m_ctx_00 = local_48;
          local_48 = (c2m_ctx_t)realloc(local_48,(size_t)pcVar33);
          pVVar16->varr = (token_arr_t *)local_48;
          pVVar16->size = (size_t)pMVar36;
          pMVar39 = (MIR_context_t)((long)&((MIR_context_t)pVVar16->els_num)->gen_ctx + 1);
          pMVar27 = (MIR_context_t)pVVar16->els_num;
        }
        pVVar16->els_num = (size_t)pMVar39;
        local_48->env[0].__jmpbuf[(long)((long)&pMVar27[-1].wrapper_end_addr + 6)] = (long)puVar17;
        if ((pMVar31 == (MIR_context_t)0x0) && (pMVar39 == (MIR_context_t)0x1)) {
          if (pVVar16->varr == (token_arr_t *)0x0) goto LAB_00191cdc;
          pcVar34 = (c2m_ctx_t)*pVVar16->varr;
          if (pcVar34 == (c2m_ctx_t)0x0) goto LAB_00191ce1;
          if (pcVar34->ctx == (MIR_context_t)0x0) {
            c2m_ctx_00 = (c2m_ctx_t)pcVar34->env[0].__jmpbuf[0];
            pVVar16->els_num = 0;
            if (c2m_ctx_00 == (c2m_ctx_t)0x0) goto LAB_00191cfa;
LAB_00191c30:
            free(c2m_ctx_00);
            free(pcVar34);
            c2m_ctx_00 = pcVar34;
            goto LAB_00191c3d;
          }
          if (pcVar34->ctx == (MIR_context_t)0x1) {
            c2m_ctx_00 = (c2m_ctx_t)pcVar34->env[0].__jmpbuf[0];
            if (c2m_ctx_00 == (c2m_ctx_t)0x0) goto LAB_00191cf5;
            if (*(short *)&c2m_ctx_00->ctx->gen_ctx == 0x20) {
              pVVar16->els_num = 0;
              goto LAB_00191c30;
            }
          }
        }
        if (pMVar39 <= pMVar31) {
          if (pMVar31 <= pMVar39) goto LAB_00191c3d;
          local_80 = (MIR_context_t)0x1c1a1d;
          goto LAB_00191b75;
        }
        ppVVar21 = pVVar16->varr;
        if (ppVVar21 == (token_arr_t *)0x0) goto LAB_00191ce6;
        pVVar20 = ppVVar21[(long)pMVar31];
        if (pVVar20 == (token_arr_t)0x0) goto LAB_00191ceb;
        if (pVVar20->els_num != 0) {
          if (pVVar20->varr == (token_t *)0x0) goto LAB_00191cf0;
          pcVar19 = (c2m_ctx_t)*pVVar20->varr;
        }
        local_80 = (MIR_context_t)0x1c19fa;
        goto LAB_00191b23;
      }
      if (iVar12 == 0) {
        if (uVar26 == 0x29) goto LAB_001919f1;
        if ((bVar45) || (uVar26 != 0x2c)) goto LAB_001917fe;
        if (local_48 == (c2m_ctx_t)0x0) goto LAB_00191cd2;
        pMVar40 = (MIR_context_t)((long)&local_60->gen_ctx + 1);
        pMVar27 = local_60;
        local_60 = pMVar40;
        if (pMVar36 < pMVar40) {
          pMVar36 = (MIR_context_t)((long)&pMVar40->gen_ctx + ((ulong)pMVar40 >> 1));
          pcVar33 = (c2m_ctx_t)((long)pMVar36 * 8);
          local_48 = (c2m_ctx_t)realloc(local_48,(size_t)pcVar33);
          pVVar16->varr = (token_arr_t *)local_48;
          pVVar16->size = (size_t)pMVar36;
          pMVar27 = (MIR_context_t)pVVar16->els_num;
          local_60 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
        }
        c2m_ctx_00 = (c2m_ctx_t)&DAT_00000018;
        pVVar16->els_num = (size_t)local_60;
        local_48->env[0].__jmpbuf[(long)((long)&pMVar27[-1].wrapper_end_addr + 6)] = (long)puVar17;
        puVar17 = (ulong *)malloc(0x18);
        if (puVar17 == (ulong *)0x0) goto LAB_00191caf;
        c2m_ctx_00 = (c2m_ctx_t)0x80;
        *puVar17 = 0;
        puVar17[1] = 0x10;
        pvVar18 = malloc(0x80);
        puVar17[2] = (ulong)pvVar18;
        iVar12 = 0;
        if (local_60 == pMVar39) {
          pVVar24 = pmVar5->params;
          if (((pVVar24 == (VARR_token_t *)0x0) ||
              (pMVar27 = (MIR_context_t)pVVar24->varr, pMVar27 == (MIR_context_t)0x0)) ||
             ((MIR_context_t)pVVar24->els_num <= pMVar39)) goto LAB_00191cbe;
          iVar13 = strcmp(*(char **)(*(long *)((long)pMVar27 + (long)pMVar31 * 8 + -8) + 0x28),"..."
                         );
          bVar45 = iVar13 == 0;
          local_60 = pMVar39;
          local_68 = pMVar39;
        }
        else {
          bVar45 = false;
          local_68 = local_60;
        }
      }
      else {
LAB_001917fe:
        pvVar18 = (void *)puVar17[2];
        if (pvVar18 == (void *)0x0) goto LAB_00191cb9;
        uVar30 = *puVar17;
        uVar38 = uVar30 + 1;
        if (puVar17[1] < uVar38) {
          uVar38 = (uVar38 >> 1) + uVar38;
          pvVar18 = realloc(pvVar18,uVar38 * 8);
          puVar17[2] = (ulong)pvVar18;
          puVar17[1] = uVar38;
          uVar30 = *puVar17;
          uVar38 = uVar30 + 1;
        }
        *puVar17 = uVar38;
        *(c2m_ctx_t *)((long)pvVar18 + uVar30 * 8) = pcVar19;
        if (*(short *)&pcVar19->ctx == 0x28) {
          iVar12 = iVar12 + 1;
        }
        else if (*(short *)&pcVar19->ctx == 0x29) {
          iVar12 = iVar12 + -1;
        }
      }
      bVar46 = *(short *)&pcVar19->ctx == 10;
    } while( true );
  }
  if (pVVar24->varr != (token_t *)0x0) {
    bVar45 = *(short *)*pVVar24->varr == 0x10f;
    goto LAB_00191751;
  }
  goto LAB_00191cd7;
LAB_00191b75:
  pMVar40 = (MIR_context_t)((long)&pMVar39->gen_ctx + 1);
  c2m_ctx_00 = (c2m_ctx_t)&DAT_00000018;
  pVVar20 = (token_arr_t)malloc(0x18);
  if (pVVar20 != (token_arr_t)0x0) {
    c2m_ctx_00 = (c2m_ctx_t)0x80;
    pVVar20->els_num = 0;
    pVVar20->size = 0x10;
    pptVar25 = (token_t *)malloc(0x80);
    pVVar20->varr = pptVar25;
    ppVVar21 = pVVar16->varr;
    if (ppVVar21 != (token_arr_t *)0x0) goto code_r0x00191bb5;
    try_param_macro_call_cold_6();
LAB_00191cb9:
    try_param_macro_call_cold_1();
LAB_00191cbe:
    try_param_macro_call_cold_2();
    goto LAB_00191cc3;
  }
  goto LAB_00191caf;
code_r0x00191bb5:
  pMVar27 = pMVar39;
  if (pMVar36 <= pMVar39) {
    pMVar36 = (MIR_context_t)((long)&pMVar40->gen_ctx + ((ulong)pMVar40 >> 1));
    pcVar33 = (c2m_ctx_t)((long)pMVar36 * 8);
    ppVVar21 = (token_arr_t *)realloc(ppVVar21,(size_t)pcVar33);
    pVVar16->varr = ppVVar21;
    pVVar16->size = (size_t)pMVar36;
  }
  pVVar16->els_num = (size_t)pMVar40;
  ppVVar21[(long)pMVar39] = pVVar20;
  pMVar39 = pMVar40;
  if (pMVar31 <= pMVar40) goto LAB_00191bf5;
  goto LAB_00191b75;
  while( true ) {
    pcVar42 = (c2m_ctx_t)((long)&pcVar42[-1].gen_ctx + 7);
    pcVar43 = (c2m_ctx_t)&((pos_t *)pcVar43)->lno;
    if (pcVar34 == pcVar42) break;
LAB_00191dfe:
    pcVar19 = (c2m_ctx_t)((pos_t *)pcVar43)->fname;
    if (*(int *)(pcVar19->env[0].__jmpbuf + 1) == 0x19) {
      pVVar10 = c2m_ctx_00->symbol_text;
      if ((pVVar10 == (VARR_char *)0x0) ||
         (pcVar22 = (c2m_ctx_t)pVVar10->varr, pcVar22 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar10->els_num = 0;
      pVVar11 = c2m_ctx_00->temp_string;
      if ((pVVar11 == (VARR_char *)0x0) || (pVVar11->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar11->els_num = 0;
      pcVar19 = (c2m_ctx_t)pVVar10->els_num;
      puVar28 = (undefined1 *)((long)&pcVar19->ctx + 1);
      if ((undefined1 *)pVVar10->size < puVar28) {
        pcVar34 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)(puVar28 + ((ulong)puVar28 >> 1)));
        pVVar10->varr = (char *)pcVar22;
        pVVar10->size = (size_t)(puVar28 + ((ulong)puVar28 >> 1));
        pcVar19 = (c2m_ctx_t)pVVar10->els_num;
        puVar28 = (undefined1 *)((long)&pcVar19->ctx + 1);
      }
      pVVar10->els_num = (size_t)puVar28;
      *(undefined1 *)((long)pcVar19->env[0].__saved_mask.__val + (long)(pcVar22->env + -1) + 0x60) =
           0x3c;
      if (pcVar37 < (c2m_ctx_t)((long)pcVar32 - (long)pcVar42)) goto LAB_00191f68;
      goto LAB_0019205a;
    }
  }
LAB_00191e17:
  if (pcVar22 != (c2m_ctx_t)0x0) goto LAB_00191e1c;
  goto LAB_00191e37;
LAB_00191f68:
  do {
    lVar7 = pcVar33->env[0].__jmpbuf[0];
    if ((lVar7 == 0) || ((c2m_ctx_t)pcVar33->ctx <= pcVar37)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar35 = *(char **)(*(long *)(lVar7 + (long)pcVar37 * 8) + 0x28);
    cVar1 = *pcVar35;
    while (cVar1 != '\0') {
      pVVar10 = c2m_ctx_00->symbol_text;
      pcVar22 = (c2m_ctx_t)pVVar10->varr;
      if (pcVar22 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar41 = pVVar10->els_num;
      uVar38 = sVar41 + 1;
      if (pVVar10->size < uVar38) {
        pcVar43 = (c2m_ctx_t)((uVar38 >> 1) + uVar38);
        pcVar19 = pcVar43;
        pcVar34 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar43);
        pVVar10->varr = (char *)pcVar22;
        pVVar10->size = (size_t)pcVar43;
        sVar41 = pVVar10->els_num;
        uVar38 = sVar41 + 1;
      }
      pVVar10->els_num = uVar38;
      *(char *)((long)pcVar22->env[0].__jmpbuf + (sVar41 - 0x10)) = cVar1;
      pVVar10 = c2m_ctx_00->temp_string;
      pcVar22 = (c2m_ctx_t)pVVar10->varr;
      if (pcVar22 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar41 = pVVar10->els_num;
      cVar1 = *pcVar35;
      uVar38 = sVar41 + 1;
      if (pVVar10->size < uVar38) {
        pcVar43 = (c2m_ctx_t)((uVar38 >> 1) + uVar38);
        pcVar19 = pcVar43;
        pcVar34 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar43);
        pVVar10->varr = (char *)pcVar22;
        pVVar10->size = (size_t)pcVar43;
        sVar41 = pVVar10->els_num;
        uVar38 = sVar41 + 1;
      }
      pVVar10->els_num = uVar38;
      *(char *)((long)pcVar22->env[0].__jmpbuf + (sVar41 - 0x10)) = cVar1;
      cVar1 = pcVar35[1];
      pcVar35 = pcVar35 + 1;
    }
    pcVar37 = (c2m_ctx_t)((long)&pcVar37->ctx + 1);
  } while ((c2m_ctx_t)((long)pcVar32 - (long)pcVar42) != pcVar37);
LAB_0019205a:
  pVVar10 = c2m_ctx_00->symbol_text;
  pcVar22 = (c2m_ctx_t)pVVar10->varr;
  if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar41 = pVVar10->els_num;
  uVar38 = sVar41 + 1;
  if (pVVar10->size < uVar38) {
    pcVar43 = (c2m_ctx_t)((uVar38 >> 1) + uVar38);
    pcVar19 = pcVar43;
    pcVar34 = pcVar22;
    pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar43);
    pVVar10->varr = (char *)pcVar22;
    pVVar10->size = (size_t)pcVar43;
    sVar41 = pVVar10->els_num;
    uVar38 = sVar41 + 1;
  }
  pVVar10->els_num = uVar38;
  *(undefined1 *)((long)pcVar22->env[0].__jmpbuf + (sVar41 - 0x10)) = 0x3e;
  pVVar10 = c2m_ctx_00->symbol_text;
  pcVar22 = (c2m_ctx_t)pVVar10->varr;
  if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar41 = pVVar10->els_num;
  uVar38 = sVar41 + 1;
  if (pVVar10->size < uVar38) {
    pcVar43 = (c2m_ctx_t)((uVar38 >> 1) + uVar38);
    pcVar19 = pcVar43;
    pcVar34 = pcVar22;
    pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar43);
    pVVar10->varr = (char *)pcVar22;
    pVVar10->size = (size_t)pcVar43;
    sVar41 = pVVar10->els_num;
    uVar38 = sVar41 + 1;
  }
  pVVar10->els_num = uVar38;
  *(undefined1 *)((long)pcVar22->env[0].__jmpbuf + (sVar41 - 0x10)) = 0;
  pVVar10 = c2m_ctx_00->temp_string;
  pcVar35 = pVVar10->varr;
  if (pcVar35 == (char *)0x0) goto LAB_0019226f;
  sVar41 = pVVar10->els_num;
  uVar38 = sVar41 + 1;
  if (pVVar10->size < uVar38) {
    __size = (uVar38 >> 1) + uVar38;
    pcVar35 = (char *)realloc(pcVar35,__size);
    pVVar10->varr = pcVar35;
    pVVar10->size = __size;
    sVar41 = pVVar10->els_num;
    uVar38 = sVar41 + 1;
  }
  pVVar10->els_num = uVar38;
  pcVar35[sVar41] = '\0';
  pcVar19 = (c2m_ctx_t)((ulong)pcVar32 & 0xffffffff);
  pcVar34 = pcVar33;
  del_tokens((VARR_token_t *)pcVar33,(int)pcVar32,-(int)pcVar42);
  if (c2m_ctx_00->symbol_text != (VARR_char *)0x0) {
    if (c2m_ctx_00->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar35 = c2m_ctx_00->symbol_text->varr;
    sVar47 = uniq_cstr(c2m_ctx_00,c2m_ctx_00->temp_string->varr);
    n = new_node(c2m_ctx_00,N_STR);
    add_pos(c2m_ctx_00,n,p);
    (n->u).s = sVar47;
    sVar47 = uniq_cstr(c2m_ctx_00,pcVar35);
    pcVar19 = (c2m_ctx_t)0x30;
    pcVar34 = c2m_ctx_00;
    puVar23 = (undefined4 *)reg_malloc(c2m_ctx_00,0x30);
    *puVar23 = 0x13e;
    *(VARR_token_t **)(puVar23 + 2) = pVVar24;
    *(VARR_token_t **)(puVar23 + 4) = pVVar8;
    *(char **)(puVar23 + 10) = sVar47.s;
    puVar23[6] = 0;
    *(node_t_conflict *)(puVar23 + 8) = n;
    lVar7 = pcVar33->env[0].__jmpbuf[0];
    if ((lVar7 != 0) && (pcVar22 = (c2m_ctx_t)pcVar33->ctx, pcVar32 < pcVar22)) {
      *(undefined4 **)(lVar7 + (long)pcVar32 * 8) = puVar23;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    free(c2m_ctx_00);
    free(pcVar33);
    c2m_ctx_00 = pcVar33;
    pMVar39 = pMVar27;
    if (pMVar27 <= pMVar31) break;
LAB_00191b23:
    pMVar27 = (MIR_context_t)((long)&pMVar39[-1].wrapper_end_addr + 7);
    pVVar16->els_num = (size_t)pMVar27;
    pcVar33 = (c2m_ctx_t)ppVVar21[(long)((long)&pMVar39[-1].wrapper_end_addr + 7)];
    if ((pcVar33 == (c2m_ctx_t)0x0) ||
       (c2m_ctx_00 = (c2m_ctx_t)pcVar33->env[0].__jmpbuf[0], c2m_ctx_00 == (c2m_ctx_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00191caf;
    }
  }
LAB_00191bf5:
  pcVar33 = (c2m_ctx_t)((pos_t *)&pcVar19->options)->fname;
  in_R8 = (char **)pmVar5->id->repr;
  error(c2m_ctx,local_80,(char *)pcVar33,pcVar19->env[0].__jmpbuf[0]);
  pMVar27 = local_80;
  c2m_ctx_00 = c2m_ctx;
LAB_00191c3d:
  pmVar15->args = pVVar16;
  pVVar6 = ppVar4->macro_call_stack;
  __ptr = pVVar6->varr;
  if (__ptr != (macro_call_t *)0x0) {
    sVar41 = pVVar6->els_num;
    uVar38 = sVar41 + 1;
    if (pVVar6->size < uVar38) {
      sVar41 = (uVar38 >> 1) + uVar38;
      __ptr = (macro_call_t *)realloc(__ptr,sVar41 * 8);
      pVVar6->varr = __ptr;
      pVVar6->size = sVar41;
      sVar41 = pVVar6->els_num;
      uVar38 = sVar41 + 1;
    }
    pVVar6->els_num = uVar38;
    __ptr[sVar41] = pmVar15;
    return pmVar15;
  }
LAB_00191ccd:
  try_param_macro_call_cold_8();
LAB_00191cd2:
  try_param_macro_call_cold_3();
LAB_00191cd7:
  try_param_macro_call_cold_15();
LAB_00191cdc:
  try_param_macro_call_cold_13();
LAB_00191ce1:
  try_param_macro_call_cold_12();
LAB_00191ce6:
  try_param_macro_call_cold_11();
LAB_00191ceb:
  try_param_macro_call_cold_10();
LAB_00191cf0:
  try_param_macro_call_cold_7();
LAB_00191cf5:
  try_param_macro_call_cold_4();
LAB_00191cfa:
  try_param_macro_call_cold_5();
  pmVar15 = (macro_call_t)c2m_ctx_00->env[0].__jmpbuf[0];
  if (pmVar15 != (macro_call_t)0x0) {
    pMVar31 = c2m_ctx_00->ctx;
    pMVar27 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
    if ((MIR_context_t)c2m_ctx_00->options < pMVar27) {
      pcVar44 = (c2mir_options *)((long)&pMVar27->gen_ctx + ((ulong)pMVar27 >> 1));
      pmVar15 = (macro_call_t)realloc(pmVar15,(long)pcVar44 * 8);
      c2m_ctx_00->env[0].__jmpbuf[0] = (long)pmVar15;
      c2m_ctx_00->options = pcVar44;
      pMVar31 = c2m_ctx_00->ctx;
      pMVar27 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
    }
    c2m_ctx_00->ctx = pMVar27;
    (&pmVar15->macro)[(long)pMVar31] = (macro_t)pcVar33;
    return pmVar15;
  }
  unget_next_pptoken_cold_1();
  if (((c2m_ctx_00 != (c2m_ctx_t)0x0) && (lVar7 = c2m_ctx_00->env[0].__jmpbuf[0], lVar7 != 0)) &&
     (pMVar27 = c2m_ctx_00->ctx, pMVar27 != (MIR_context_t)0x0)) {
    return *(macro_call_t *)(lVar7 + -8 + (long)pMVar27 * 8);
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar19 = pcVar33;
  pcVar34 = c2m_ctx_00;
  if (pcVar33 == (c2m_ctx_t)0x0) {
LAB_00192242:
    get_header_name_cold_15();
LAB_00192247:
    get_header_name_cold_13();
LAB_0019224c:
    get_header_name_cold_12();
  }
  else {
    pcVar22 = (c2m_ctx_t)pcVar33->ctx;
    if (pcVar22 != (c2m_ctx_t)0x0) {
      pcVar34 = (c2m_ctx_t)pcVar33->env[0].__jmpbuf[0];
      if (pcVar34 == (c2m_ctx_t)0x0) goto LAB_00192247;
      pcVar32 = (c2m_ctx_t)0x0;
      pcVar43 = pcVar34;
      do {
        pcVar43 = (c2m_ctx_t)&pcVar43->options;
        pcVar19 = (c2m_ctx_t)pcVar34->env[0].__jmpbuf[(long)((long)&pcVar32[-1].gen_ctx + 6)];
        if (*(short *)&pcVar19->ctx != 0x20) {
          if ((*(int *)(pcVar19->env[0].__jmpbuf + 1) != 0x17) ||
             (pcVar37 = (c2m_ctx_t)((long)&pcVar32->ctx + 1), pcVar22 <= pcVar37))
          goto LAB_00191e17;
          pVVar24 = (VARR_token_t *)((pos_t *)&pcVar19->options)->fname;
          pVVar8 = (VARR_token_t *)pcVar19->env[0].__jmpbuf[0];
          p = *(pos_t *)&pcVar19->options;
          pcVar34 = (c2m_ctx_t)((long)pcVar32 - (long)pcVar22);
          pcVar42 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        pcVar32 = (c2m_ctx_t)((long)&pcVar32->ctx + 1);
      } while (pcVar32 != pcVar22);
LAB_00191e1c:
      puVar9 = (undefined8 *)pcVar33->env[0].__jmpbuf[0];
      if (puVar9 != (undefined8 *)0x0) {
        pcVar43 = (c2m_ctx_t)(ulong)(*(short *)*puVar9 == 0x20);
        goto LAB_00191e3b;
      }
      goto LAB_0019224c;
    }
LAB_00191e37:
    pcVar22 = (c2m_ctx_t)0x0;
    pcVar43 = (c2m_ctx_t)0x0;
LAB_00191e3b:
    pcVar19 = (c2m_ctx_t)((long)&pcVar22[-1].gen_ctx + 7);
    if (pcVar43 != pcVar19) {
LAB_00191e88:
      error(c2m_ctx_00,0x1c1443,format,pMVar27);
      return (macro_call_t)0x0;
    }
    if ((pcVar43 < pcVar22) && (lVar7 = pcVar33->env[0].__jmpbuf[0], lVar7 != 0)) {
      ptVar14 = *(token_t *)(lVar7 + (long)pcVar43 * 8);
      sVar3 = *(short *)ptVar14;
      if ((sVar3 == 0x102) || (sVar3 == 0x13e)) {
        pmVar15 = (macro_call_t)get_include_fname(c2m_ctx_00,ptVar14,in_R8);
        return pmVar15;
      }
      goto LAB_00191e88;
    }
  }
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  pmVar15 = (macro_call_t)malloc(0x30);
  pcVar35 = &DAT_00000018;
  pmVar15->macro = (macro_t)pcVar34;
  (pmVar15->pos).fname = (char *)pcVar19;
  (pmVar15->pos).lno = (int)extraout_RDX;
  (pmVar15->pos).ln_pos = (int)((ulong)extraout_RDX >> 0x20);
  pmVar15->repl_pos = 0;
  pmVar15->args = (VARR_token_arr_t *)0x0;
  pVVar24 = (VARR_token_t *)malloc(0x18);
  pmVar15->repl_buffer = pVVar24;
  if (pVVar24 == (VARR_token_t *)0x0) {
    mir_varr_error(pcVar35);
  }
  pVVar24->els_num = 0;
  pVVar24->size = 0x40;
  pptVar25 = (token_t *)malloc(0x200);
  pVVar24->varr = pptVar25;
  return pmVar15;
}

Assistant:

static macro_call_t try_param_macro_call (c2m_ctx_t c2m_ctx, macro_t m, token_t macro_id) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;
  token_t t1 = get_next_pptoken (c2m_ctx), t2 = NULL;

  while (t1->code == T_EOR) {
    pop_macro_call (c2m_ctx);
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code == ' ' || t1->code == '\n') {
    t2 = t1;
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code != '(') { /* no args: it is not a macro call */
    unget_next_pptoken (c2m_ctx, t1);
    if (t2 != NULL) unget_next_pptoken (c2m_ctx, t2);
    out_token (c2m_ctx, macro_id);
    return NULL;
  }
  mc = new_macro_call (m, macro_id->pos);
  find_args (c2m_ctx, mc);
  VARR_PUSH (macro_call_t, macro_call_stack, mc);
  return mc;
}